

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.hpp
# Opt level: O1

uint64_t __thiscall bit_stream::get_int(bit_stream *this,size_t bits)

{
  uint *puVar1;
  uint32_t *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  byte bVar6;
  
  if (bits != 0) {
    puVar1 = this->last_ptr;
    if (this->cur_ptr == puVar1 + 1) {
      puVar2 = this->of;
      this->cur_ptr = this->first_ptr;
      this->of = puVar2 + 1;
      *this->first_ptr = *puVar2;
      this->bytes_consumed = this->bytes_consumed + 4;
    }
    puVar3 = this->cur_ptr;
    if ((puVar3 == puVar1) || (0x20 < this->in_word_offset + bits)) {
      puVar4 = this->of;
      this->of = puVar4 + 1;
      *puVar1 = *puVar4;
      this->bytes_consumed = this->bytes_consumed + 4;
    }
    uVar5 = *puVar3 >> (this->in_word_offset & 0x1f);
    bVar6 = this->in_word_offset + (char)bits;
    this->in_word_offset = bVar6;
    if (bVar6 < 0x20) {
      uVar5 = uVar5 & *(uint *)(::bits::lo_set + (bits & 0xff) * 4);
    }
    else if (bVar6 == 0x20) {
      this->in_word_offset = '\0';
      this->cur_ptr = puVar3 + 1;
    }
    else {
      bVar6 = bVar6 & 0x1f;
      this->in_word_offset = bVar6;
      this->cur_ptr = puVar3 + 1;
      uVar5 = uVar5 | (*(uint *)(::bits::lo_set + (ulong)bVar6 * 4) & puVar3[1]) <<
                      (((uint)bits & 0xff) - (uint)bVar6 & 0x1f);
    }
    if ((this->cur_ptr == puVar1) && (this->in_word_offset != '\0')) {
      this->cur_ptr = this->first_ptr;
      *this->first_ptr = *puVar1;
    }
    return (ulong)uVar5;
  }
  return 0;
}

Assistant:

uint64_t get_int(size_t bits)
    {
        if (bits == 0)
            return 0;
        if (cur_ptr == last_ptr + 1) {
            cur_ptr = first_ptr;
            *first_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        if (cur_ptr == last_ptr || (size_t(in_word_offset) + bits > 32)) {
            *last_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        uint32_t x = bits::read_int(cur_ptr, in_word_offset, bits);
        if (cur_ptr == last_ptr && in_word_offset != 0) {
            cur_ptr = first_ptr;
            *first_ptr = *last_ptr;
        }
        return x;
    }